

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O2

unsigned_long_long strpool_inject(strpool_t *pool,char *string,int length)

{
  char cVar1;
  uint uVar2;
  strpool_internal_block_t *psVar3;
  char *pcVar4;
  int i;
  int iVar5;
  uint uVar6;
  unsigned_long_long uVar7;
  ulong uVar8;
  strpool_internal_entry_t *psVar9;
  strpool_internal_hash_slot_t *psVar10;
  strpool_internal_handle_t *psVar11;
  char cVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong __n;
  int iVar23;
  char *data;
  int *piVar24;
  uint *puVar25;
  strpool_internal_hash_slot_t *psVar26;
  long lVar27;
  uint uVar28;
  int local_68;
  
  uVar7 = 0;
  if (-1 < length && string != (char *)0x0) {
    uVar8 = (ulong)(uint)pool->block_count;
    if (pool->block_count < 1) {
      uVar8 = uVar7;
    }
    for (; __n = (ulong)(uint)length, uVar8 * 0x20 != uVar7; uVar7 = uVar7 + 0x20) {
      lVar13 = *(long *)((long)&pool->blocks->data + uVar7);
      if (((char *)(lVar13 + 8U) <= string) &&
         (string < (char *)(lVar13 + *(int *)((long)&pool->blocks->capacity + uVar7)))) {
        if ((*(int *)(string + -4) == length) &&
           ((string[__n] == '\0' && (uVar20 = *(uint *)(string + -8), uVar20 != 0))))
        goto LAB_0010327c;
        break;
      }
    }
    if (pool->ignore_case == 0) {
      uVar20 = 0x1505;
      for (uVar8 = 0; __n != uVar8; uVar8 = uVar8 + 1) {
        uVar20 = uVar20 * 0x21 ^ (int)string[uVar8];
      }
    }
    else {
      uVar20 = 0x1505;
      for (uVar8 = 0; __n != uVar8; uVar8 = uVar8 + 1) {
        cVar1 = string[uVar8];
        cVar12 = cVar1 + -0x20;
        if (0x19 < (byte)(cVar1 + 0x9fU)) {
          cVar12 = cVar1;
        }
        uVar20 = (int)cVar12 ^ uVar20 * 0x21;
      }
    }
    uVar20 = uVar20 + (uVar20 == 0);
LAB_0010327c:
    uVar6 = pool->hash_capacity;
    uVar8 = (ulong)uVar6;
    uVar15 = uVar6 - 1;
    uVar17 = uVar15 & uVar20;
    psVar26 = pool->hash_table;
    iVar23 = psVar26[(int)uVar17].base_count;
    uVar28 = uVar17;
    uVar16 = uVar17;
    while (0 < iVar23) {
      uVar2 = psVar26[(int)uVar16].hash_key;
      if ((uVar2 == 0) && (psVar26[(int)uVar28].hash_key != 0)) {
        uVar28 = uVar16;
      }
      if (((uVar2 & uVar15) == uVar17) && (iVar23 = iVar23 + -1, uVar2 == uVar20)) {
        iVar18 = psVar26[(int)uVar16].entry_index;
        psVar9 = pool->entries;
        if (psVar9[iVar18].length == length) {
          if (pool->ignore_case == 0) {
            iVar5 = bcmp(psVar9[iVar18].data + 8,string,__n);
          }
          else {
            iVar5 = strncasecmp(psVar9[iVar18].data + 8,string,__n);
          }
          if (iVar5 == 0) {
            local_68 = psVar9[iVar18].handle_index;
            psVar11 = pool->handles + local_68;
            goto LAB_00103820;
          }
        }
      }
      uVar16 = uVar16 + 1 & uVar15;
    }
    if ((int)((int)uVar6 / -3 + uVar6) <= pool->entry_count) {
      pool->hash_capacity = uVar6 * 2;
      uVar22 = 0;
      psVar10 = (strpool_internal_hash_slot_t *)
                (**pool->memctx)(0,(long)(int)uVar6 * 0x18,0,0,0,0,
                                 *(undefined8 *)((long)pool->memctx + 8));
      pool->hash_table = psVar10;
      if (psVar10 == (strpool_internal_hash_slot_t *)0x0) {
        __assert_fail("pool->hash_table",
                      "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                      ,0x33c,"void strpool_internal_expand_hash_table(strpool_t *)");
      }
      memset(psVar10,0,(long)pool->hash_capacity * 0xc);
      if ((int)uVar6 < 1) {
        uVar8 = 0;
      }
      for (; uVar22 != uVar8; uVar22 = uVar22 + 1) {
        uVar6 = psVar26[uVar22].hash_key;
        if ((long)(int)uVar6 != 0) {
          uVar21 = (long)pool->hash_capacity - 1;
          uVar14 = uVar21 & (long)(int)uVar6;
          psVar10 = pool->hash_table;
          uVar19 = uVar14 & 0xffffffff;
          while( true ) {
            iVar18 = (int)uVar19;
            if (psVar10[iVar18].hash_key == 0) break;
            uVar19 = (ulong)(iVar18 + 1U & (uint)uVar21);
          }
          psVar10[iVar18].hash_key = uVar6;
          iVar5 = psVar26[uVar22].entry_index;
          psVar10[iVar18].entry_index = iVar5;
          pool->entries[iVar5].hash_slot = iVar18;
          psVar10[uVar14].base_count = psVar10[uVar14].base_count + 1;
        }
      }
      (**pool->memctx)(psVar26,0,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8));
      uVar6 = pool->hash_capacity;
      uVar16 = uVar6 - 1;
      uVar17 = uVar16 & uVar20;
      psVar26 = pool->hash_table;
      uVar28 = uVar17;
      uVar15 = uVar17;
      for (; iVar23 != 0; iVar23 = iVar23 - (uint)((psVar26[lVar13].hash_key & uVar16) == uVar17)) {
        lVar13 = (long)(int)uVar15;
        if ((psVar26[lVar13].hash_key == 0) && (psVar26[(int)uVar28].hash_key != 0)) {
          uVar28 = uVar15;
        }
        uVar15 = uVar15 + 1 & uVar16;
      }
    }
    while (psVar26[(int)uVar28].hash_key != 0) {
      uVar28 = uVar28 + 1 & uVar6 - 1;
    }
    iVar23 = pool->entry_capacity;
    if (iVar23 <= pool->entry_count) {
      pool->entry_capacity = iVar23 * 2;
      psVar9 = (strpool_internal_entry_t *)
               (**pool->memctx)(0,(long)iVar23 << 6,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8))
      ;
      if (psVar9 == (strpool_internal_entry_t *)0x0) {
        __assert_fail("new_entries",
                      "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                      ,0x359,"void strpool_internal_expand_entries(strpool_t *)");
      }
      memcpy(psVar9,pool->entries,(long)pool->entry_count << 5);
      (**pool->memctx)(pool->entries,0,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8));
      pool->entries = psVar9;
      psVar26 = pool->hash_table;
      if (psVar26[(int)uVar28].hash_key != 0) goto LAB_0010385c;
    }
    if ((pool->hash_capacity - 1U & uVar20) != uVar17) {
LAB_0010385c:
      __assert_fail("!pool->hash_table[ slot ].hash_key && ( hash & ( (unsigned int) pool->hash_capacity - 1 ) ) == (unsigned int) base_slot"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                    ,0x3e9,"unsigned long long strpool_inject(strpool_t *, const char *, int)");
    }
    psVar26[(int)uVar28].hash_key = uVar20;
    iVar23 = pool->entry_count;
    psVar26[(int)uVar28].entry_index = iVar23;
    psVar26[(int)uVar17].base_count = psVar26[(int)uVar17].base_count + 1;
    local_68 = pool->handle_count;
    iVar18 = pool->handle_capacity;
    if (local_68 < iVar18) {
      lVar13 = (long)local_68;
      psVar11 = pool->handles;
      psVar11[lVar13].counter = 1;
      pool->handle_count = local_68 + 1;
    }
    else {
      local_68 = pool->handle_freelist_head;
      lVar13 = (long)local_68;
      if (lVar13 < 0) {
        pool->handle_capacity = iVar18 * 2;
        psVar11 = (strpool_internal_handle_t *)
                  (**pool->memctx)(0,(long)iVar18 << 4,0,0,0,0,
                                   *(undefined8 *)((long)pool->memctx + 8));
        if (psVar11 == (strpool_internal_handle_t *)0x0) {
          __assert_fail("new_handles",
                        "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                        ,0x365,"void strpool_internal_expand_handles(strpool_t *)");
        }
        memcpy(psVar11,pool->handles,(long)pool->handle_count << 3);
        (**pool->memctx)(pool->handles,0,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8));
        pool->handles = psVar11;
        local_68 = pool->handle_count;
        lVar13 = (long)local_68;
        psVar11[lVar13].counter = 1;
        pool->handle_count = local_68 + 1;
        iVar23 = pool->entry_count;
      }
      else {
        psVar11 = pool->handles;
        iVar18 = psVar11[lVar13].entry_index;
        if (pool->handle_freelist_tail == local_68) {
          pool->handle_freelist_tail = iVar18;
        }
        pool->handle_freelist_head = iVar18;
      }
    }
    psVar11[lVar13].entry_index = iVar23;
    psVar9 = pool->entries + iVar23;
    pool->entry_count = iVar23 + 1;
    uVar6 = length + 9U;
    if ((int)(length + 9U) < pool->min_data_size) {
      uVar6 = pool->min_data_size;
    }
    uVar6 = strpool_internal_pow2ceil(uVar6);
    uVar22 = 0;
    uVar8 = (ulong)(uint)pool->block_count;
    if (pool->block_count < 1) {
      uVar8 = uVar22;
    }
    psVar3 = pool->blocks;
    for (; uVar22 != uVar8; uVar22 = uVar22 + 1) {
      piVar24 = &psVar3[uVar22].free_list;
      uVar14 = 0xffffffff;
      while( true ) {
        uVar16 = *piVar24;
        lVar27 = (long)(int)uVar16;
        if (lVar27 < 0) break;
        pcVar4 = psVar3[uVar22].data;
        puVar25 = (uint *)(pcVar4 + lVar27);
        uVar15 = *(uint *)(pcVar4 + lVar27);
        if ((int)uVar15 / 2 < (int)uVar6) {
          if ((int)uVar6 <= (int)uVar15) {
            if ((int)uVar14 < 0) {
              psVar3[uVar22].free_list = puVar25[1];
            }
            else {
              *(uint *)(pcVar4 + uVar14 + 4) = puVar25[1];
            }
            goto LAB_001037be;
          }
          break;
        }
        piVar24 = (int *)(puVar25 + 1);
        uVar14 = (ulong)uVar16;
      }
    }
    iVar23 = pool->current_block;
    puVar25 = (uint *)psVar3[iVar23].tail;
    uVar15 = uVar6;
    if ((*(int *)&psVar3[iVar23].data - (int)puVar25) + psVar3[iVar23].capacity < (int)uVar6) {
      uVar16 = pool->block_size;
      if (pool->block_size < (int)uVar6) {
        uVar16 = uVar6;
      }
      iVar23 = strpool_internal_add_block(pool,uVar16);
      pool->current_block = iVar23;
      puVar25 = (uint *)pool->blocks[iVar23].tail;
      pool->blocks[iVar23].tail = (char *)((long)(int)uVar6 + (long)puVar25);
    }
    else {
      psVar3[iVar23].tail = (char *)((long)(int)uVar6 + (long)puVar25);
    }
LAB_001037be:
    psVar9->hash_slot = uVar28;
    psVar9->handle_index = local_68;
    psVar9->data = (char *)puVar25;
    psVar9->size = uVar15;
    psVar9->length = length;
    psVar9->refcount = 0;
    *puVar25 = uVar20;
    puVar25[1] = length;
    memcpy(puVar25 + 2,string,__n);
    *(undefined1 *)((long)puVar25 + __n + 8) = 0;
    psVar11 = pool->handles + lVar13;
LAB_00103820:
    uVar7 = (long)(local_68 + 1) & pool->index_mask |
            ((long)psVar11->counter & pool->counter_mask) << ((byte)pool->counter_shift & 0x3f);
  }
  return uVar7;
}

Assistant:

STRPOOL_U64 strpool_inject( strpool_t* pool, char const* string, int length )
    {
    if( !string || length < 0 ) return 0;

    STRPOOL_U32 hash = strpool_internal_find_in_blocks( pool, string, length );
    // If no stored hash, calculate it from data
    if( !hash ) hash = strpool_internal_calculate_hash( string, length, pool->ignore_case ); 

    // Return handle to existing string, if it is already in pool
    int base_slot = (int)( hash & (STRPOOL_U32)( pool->hash_capacity - 1 ) );
    int base_count = pool->hash_table[ base_slot ].base_count;
    int slot = base_slot;
    int first_free = slot;
    while( base_count > 0 )
        {
        STRPOOL_U32 slot_hash = pool->hash_table[ slot ].hash_key;
        if( slot_hash == 0 && pool->hash_table[ first_free ].hash_key != 0 ) first_free = slot;
        int slot_base = (int)( slot_hash & (STRPOOL_U32)( pool->hash_capacity - 1 ) );
        if( slot_base == base_slot ) 
            {
            STRPOOL_ASSERT( base_count > 0 );
            --base_count;
            if( slot_hash == hash )
                {
                int index = pool->hash_table[ slot ].entry_index;
                strpool_internal_entry_t* entry = &pool->entries[ index ];
                if( entry->length == length && 
                    ( 
                       ( !pool->ignore_case &&   STRPOOL_MEMCMP( entry->data + 2 * sizeof( STRPOOL_U32 ), string, (size_t)length ) == 0 )
                    || (  pool->ignore_case && STRPOOL_STRNICMP( entry->data + 2 * sizeof( STRPOOL_U32 ), string, (size_t)length ) == 0 ) 
                    ) 
                  )
                    {
                    int handle_index = entry->handle_index;
                    return strpool_internal_make_handle( handle_index, pool->handles[ handle_index ].counter, 
                        pool->index_mask, pool->counter_shift, pool->counter_mask );
                    }
                }
            }
        slot = ( slot + 1 ) & ( pool->hash_capacity - 1 );
        }   

    // This is a new string, so let's add it

    if( pool->entry_count >= ( pool->hash_capacity  - pool->hash_capacity / 3 ) )
        {
        strpool_internal_expand_hash_table( pool );

        base_slot = (int)( hash & (STRPOOL_U32)( pool->hash_capacity - 1 ) );
        slot = base_slot;
        first_free = slot;
        while( base_count )
            {
            STRPOOL_U32 slot_hash = pool->hash_table[ slot ].hash_key;
            if( slot_hash == 0 && pool->hash_table[ first_free ].hash_key != 0 ) first_free = slot;
            int slot_base = (int)( slot_hash & (STRPOOL_U32)( pool->hash_capacity - 1 ) );
            if( slot_base == base_slot )  --base_count;
            slot = ( slot + 1 ) & ( pool->hash_capacity - 1 );
            }       
        }
        
    slot = first_free;
    while( pool->hash_table[ slot ].hash_key )
        slot = ( slot + 1 ) & ( pool->hash_capacity - 1 );

    if( pool->entry_count >= pool->entry_capacity )
        strpool_internal_expand_entries( pool );

    STRPOOL_ASSERT( !pool->hash_table[ slot ].hash_key && ( hash & ( (STRPOOL_U32) pool->hash_capacity - 1 ) ) == (STRPOOL_U32) base_slot );
    STRPOOL_ASSERT( hash );
    pool->hash_table[ slot ].hash_key = hash;
    pool->hash_table[ slot ].entry_index = pool->entry_count;
    ++pool->hash_table[ base_slot ].base_count;

    int handle_index;

    if( pool->handle_count < pool->handle_capacity )
        {
        handle_index = pool->handle_count;
        pool->handles[ pool->handle_count ].counter = 1;
        ++pool->handle_count;           
        }
    else if( pool->handle_freelist_head >= 0 )
        {
        handle_index = pool->handle_freelist_head;
        if( pool->handle_freelist_tail == pool->handle_freelist_head ) 
            pool->handle_freelist_tail = pool->handles[ pool->handle_freelist_head ].entry_index;
        pool->handle_freelist_head = pool->handles[ pool->handle_freelist_head ].entry_index;                       
        }
    else
        {
        strpool_internal_expand_handles( pool );
        handle_index = pool->handle_count;
        pool->handles[ pool->handle_count ].counter = 1;
        ++pool->handle_count;           
        }

    pool->handles[ handle_index ].entry_index = pool->entry_count;
        
    strpool_internal_entry_t* entry = &pool->entries[ pool->entry_count ];
    ++pool->entry_count;
        
    int data_size = length + 1 + (int) ( 2 * sizeof( STRPOOL_U32 ) );
    char* data = strpool_internal_get_data_storage( pool, data_size, &data_size );
    entry->hash_slot = slot;
    entry->handle_index = handle_index;
    entry->data = data;
    entry->size = data_size;
    entry->length = length;
    entry->refcount = 0;

    *(STRPOOL_U32*)(data) = hash;
    data += sizeof( STRPOOL_U32 );
    *(STRPOOL_U32*)(data) = (STRPOOL_U32) length;
    data += sizeof( STRPOOL_U32 );
    STRPOOL_MEMCPY( data, string, (size_t) length ); 
    data[ length ] = 0; // Ensure trailing zero

    return strpool_internal_make_handle( handle_index, pool->handles[ handle_index ].counter, pool->index_mask, 
        pool->counter_shift, pool->counter_mask );
    }